

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-fchmod.c
# Opt level: O2

int run_test_pipe_set_chmod(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *puVar3;
  char *pcVar4;
  undefined8 uStack_1b0;
  uv_pipe_t pipe_handle;
  stat stat_buf;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&pipe_handle,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&pipe_handle,"/tmp/uv-test-sock");
    if (iVar1 == 0) {
      iVar1 = uv_pipe_chmod(&pipe_handle,1);
      if (iVar1 == 0) {
        stat64("/tmp/uv-test-sock",(stat64 *)&stat_buf);
        if ((stat_buf.st_mode >> 8 & 1) == 0) {
          pcVar4 = "stat_buf.st_mode & S_IRUSR";
          uStack_1b0 = 0x34;
        }
        else if ((stat_buf.st_mode & 0x20) == 0) {
          pcVar4 = "stat_buf.st_mode & S_IRGRP";
          uStack_1b0 = 0x35;
        }
        else if ((stat_buf.st_mode & 4) == 0) {
          pcVar4 = "stat_buf.st_mode & S_IROTH";
          uStack_1b0 = 0x36;
        }
        else {
          iVar1 = uv_pipe_chmod(&pipe_handle,2);
          if (iVar1 == 0) {
            stat64("/tmp/uv-test-sock",(stat64 *)&stat_buf);
            if ((char)stat_buf.st_mode < '\0') {
              if ((stat_buf.st_mode & 0x10) == 0) {
                pcVar4 = "stat_buf.st_mode & S_IWGRP";
                uStack_1b0 = 0x3e;
              }
              else if ((stat_buf.st_mode & 2) == 0) {
                pcVar4 = "stat_buf.st_mode & S_IWOTH";
                uStack_1b0 = 0x3f;
              }
              else {
                iVar1 = uv_pipe_chmod(&pipe_handle,3);
                if (iVar1 == 0) {
                  stat64("/tmp/uv-test-sock",(stat64 *)&stat_buf);
                  if ((stat_buf.st_mode >> 8 & 1) == 0) {
                    pcVar4 = "stat_buf.st_mode & S_IRUSR";
                    uStack_1b0 = 0x46;
                  }
                  else if ((stat_buf.st_mode & 0x20) == 0) {
                    pcVar4 = "stat_buf.st_mode & S_IRGRP";
                    uStack_1b0 = 0x47;
                  }
                  else if ((stat_buf.st_mode & 4) == 0) {
                    pcVar4 = "stat_buf.st_mode & S_IROTH";
                    uStack_1b0 = 0x48;
                  }
                  else if ((char)stat_buf.st_mode < '\0') {
                    if ((stat_buf.st_mode & 0x10) == 0) {
                      pcVar4 = "stat_buf.st_mode & S_IWGRP";
                      uStack_1b0 = 0x4a;
                    }
                    else if ((stat_buf.st_mode & 2) == 0) {
                      pcVar4 = "stat_buf.st_mode & S_IWOTH";
                      uStack_1b0 = 0x4b;
                    }
                    else {
                      iVar1 = uv_pipe_chmod(0,3);
                      if (iVar1 == -9) {
                        iVar1 = uv_pipe_chmod(&pipe_handle,0xbc614e);
                        if (iVar1 == -0x16) {
                          uv_close(&pipe_handle,0);
                          iVar1 = uv_pipe_chmod(&pipe_handle,3);
                          if (iVar1 == -9) {
                            puVar3 = (uv_loop_t *)uv_default_loop();
                            close_loop(puVar3);
                            uVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(uVar2);
                            if (iVar1 == 0) {
                              return 0;
                            }
                            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                            uStack_1b0 = 0x58;
                          }
                          else {
                            pcVar4 = "r == UV_EBADF";
                            uStack_1b0 = 0x56;
                          }
                        }
                        else {
                          pcVar4 = "r == UV_EINVAL";
                          uStack_1b0 = 0x52;
                        }
                      }
                      else {
                        pcVar4 = "r == UV_EBADF";
                        uStack_1b0 = 0x4f;
                      }
                    }
                  }
                  else {
                    pcVar4 = "stat_buf.st_mode & S_IWUSR";
                    uStack_1b0 = 0x49;
                  }
                }
                else {
                  pcVar4 = "r == 0";
                  uStack_1b0 = 0x43;
                }
              }
            }
            else {
              pcVar4 = "stat_buf.st_mode & S_IWUSR";
              uStack_1b0 = 0x3d;
            }
          }
          else {
            pcVar4 = "r == 0";
            uStack_1b0 = 0x3a;
          }
        }
      }
      else if (iVar1 == -1) {
        puVar3 = (uv_loop_t *)uv_default_loop();
        close_loop(puVar3);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s\n","Insufficient privileges to alter pipe fmode");
          fflush(_stderr);
          return 1;
        }
        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
        uStack_1b0 = 0x2e;
      }
      else {
        pcVar4 = "r == 0";
        uStack_1b0 = 0x31;
      }
    }
    else {
      pcVar4 = "r == 0";
      uStack_1b0 = 0x28;
    }
  }
  else {
    pcVar4 = "r == 0";
    uStack_1b0 = 0x25;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-fchmod.c"
          ,uStack_1b0,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(pipe_set_chmod) {
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;
  int r;
#ifndef _WIN32
  struct stat stat_buf;
#endif

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT(r == 0);

  /* No easy way to test if this works, we will only make sure that the call is
   * successful. */
  r = uv_pipe_chmod(&pipe_handle, UV_READABLE);
  if (r == UV_EPERM) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("Insufficient privileges to alter pipe fmode");
  }
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE);
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(NULL, UV_WRITABLE | UV_READABLE);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_chmod(&pipe_handle, 12345678);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&pipe_handle, NULL);
  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT(r == UV_EBADF);

  MAKE_VALGRIND_HAPPY();
  return 0;
}